

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRotationZ.hpp
# Opt level: O1

void __thiscall
qclab::qgates::CRotationZ<std::complex<double>_>::CRotationZ
          (CRotationZ<std::complex<double>_> *this,int control,int target,real_type cos,
          real_type sin,int controlState)

{
  RotationZ<std::complex<double>_> *pRVar1;
  
  QControlledGate2<std::complex<double>_>::QControlledGate2
            (&this->super_QControlledGate2<std::complex<double>_>,control,controlState);
  (this->super_QControlledGate2<std::complex<double>_>).super_QGate2<std::complex<double>_>.
  super_QObject<std::complex<double>_>._vptr_QObject = (_func_int **)&PTR_nbQubits_005264c0;
  pRVar1 = (RotationZ<std::complex<double>_> *)operator_new(0x20);
  *(undefined ***)
   &(pRVar1->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_> =
       &PTR_nbQubits_0051ff08;
  *(int *)((long)&(pRVar1->super_QRotationGate1<std::complex<double>_>).
                  super_QGate1<std::complex<double>_> + 8) = target;
  if (target < 0) {
    __assert_fail("qubit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                  ,0x21,
                  "qclab::qgates::QGate1<std::complex<double>>::QGate1(const int) [T = std::complex<double>]"
                 );
  }
  *(undefined1 *)
   ((long)&(pRVar1->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_>
   + 0xc) = 0;
  (pRVar1->super_QRotationGate1<std::complex<double>_>).rotation_.angle_.cos_ = cos;
  *(real_type *)((long)&(pRVar1->super_QRotationGate1<std::complex<double>_>).rotation_ + 8) = sin;
  *(undefined ***)
   &(pRVar1->super_QRotationGate1<std::complex<double>_>).super_QGate1<std::complex<double>_> =
       &PTR_nbQubits_00522d48;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::RotationZ<std::complex<double>_>,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::RotationZ<std::complex<double>_>_*,_std::default_delete<qclab::qgates::RotationZ<std::complex<double>_>_>_>
  .super__Head_base<0UL,_qclab::qgates::RotationZ<std::complex<double>_>_*,_false>._M_head_impl =
       pRVar1;
  if (-1 < control) {
    if (target != control) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationZ.hpp"
                  ,0x52,
                  "qclab::qgates::CRotationZ<std::complex<double>>::CRotationZ(const int, const int, const real_type, real_type, const int) [T = std::complex<double>]"
                 );
  }
  __assert_fail("control >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CRotationZ.hpp"
                ,0x51,
                "qclab::qgates::CRotationZ<std::complex<double>>::CRotationZ(const int, const int, const real_type, real_type, const int) [T = std::complex<double>]"
               );
}

Assistant:

CRotationZ( const int control , const int target ,
                    const real_type cos , real_type sin ,
                    const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< RotationZ< T > >( target , cos , sin ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }